

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O3

UINT8 CPConv_Init(CPCONV **retCPC,char *cpFrom,char *cpTo)

{
  UINT8 UVar1;
  CPCONV *__ptr;
  char *__fromcode;
  char *__tocode;
  iconv_t pvVar2;
  size_t sVar3;
  
  __ptr = (CPCONV *)calloc(1,0x28);
  if (__ptr == (CPCONV *)0x0) {
    UVar1 = 0xff;
  }
  else {
    __fromcode = strdup(cpFrom);
    __ptr->cpFrom = __fromcode;
    __tocode = strdup(cpTo);
    __ptr->cpTo = __tocode;
    pvVar2 = iconv_open(__tocode,__fromcode);
    __ptr->hIConv = pvVar2;
    if (pvVar2 == (iconv_t)0xffffffffffffffff) {
      free(__fromcode);
      free(__tocode);
      free(__ptr);
      UVar1 = 0x80;
    }
    else {
      sVar3 = GetEncodingCharSize(__fromcode);
      __ptr->cpfCharSize = sVar3;
      sVar3 = GetEncodingCharSize(__tocode);
      __ptr->cptCharSize = sVar3;
      *retCPC = __ptr;
      UVar1 = '\0';
    }
  }
  return UVar1;
}

Assistant:

UINT8 CPConv_Init(CPCONV** retCPC, const char* cpFrom, const char* cpTo)
{
	CPCONV* cpc;
	
	cpc = (CPCONV*)calloc(1, sizeof(CPCONV));
	if (cpc == NULL)
		return 0xFF;
	
	cpc->cpFrom = strdup(cpFrom);
	cpc->cpTo = strdup(cpTo);
	cpc->hIConv = iconv_open(cpc->cpTo, cpc->cpFrom);
	if (cpc->hIConv == (iconv_t)-1)
	{
		free(cpc->cpFrom);
		free(cpc->cpTo);
		free(cpc);
		return 0x80;
	}
	cpc->cpfCharSize = GetEncodingCharSize(cpc->cpFrom);
	cpc->cptCharSize = GetEncodingCharSize(cpc->cpTo);
	
	*retCPC = cpc;
	return 0x00;
}